

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall google::protobuf::Descriptor::CopyTo(Descriptor *this,DescriptorProto *proto)

{
  int32 iVar1;
  uint uVar2;
  string *initial_value;
  string *psVar3;
  long lVar4;
  Type *pTVar5;
  Type *proto_00;
  Type *proto_01;
  Type *proto_02;
  Type *pTVar6;
  Type *pTVar7;
  MessageOptions *pMVar8;
  MessageOptions *pMVar9;
  long lVar10;
  long lVar11;
  
  initial_value = *(string **)this;
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  psVar3 = (proto->name_).ptr_;
  if (psVar3 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstanceNoArena(&proto->name_,initial_value);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar3);
  }
  if (0 < *(int *)(this + 0x2c)) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      lVar4 = *(long *)(this + 0x30);
      pTVar5 = internal::RepeatedPtrFieldBase::
               Add<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(proto->field_).super_RepeatedPtrFieldBase,(Type *)0x0);
      FieldDescriptor::CopyTo((FieldDescriptor *)(lVar4 + lVar11),pTVar5);
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0xa8;
    } while (lVar10 < *(int *)(this + 0x2c));
  }
  if (0 < *(int *)(this + 0x38)) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      lVar4 = *(long *)(this + 0x40);
      proto_00 = internal::RepeatedPtrFieldBase::
                 Add<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>::TypeHandler>
                           (&(proto->oneof_decl_).super_RepeatedPtrFieldBase,(Type *)0x0);
      OneofDescriptor::CopyTo((OneofDescriptor *)(lVar4 + lVar11),proto_00);
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0x30;
    } while (lVar10 < *(int *)(this + 0x38));
  }
  if (0 < *(int *)(this + 0x48)) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      lVar4 = *(long *)(this + 0x50);
      proto_01 = internal::RepeatedPtrFieldBase::
                 Add<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                           (&(proto->nested_type_).super_RepeatedPtrFieldBase,(Type *)0x0);
      CopyTo((Descriptor *)(lVar4 + lVar11),proto_01);
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0xa8;
    } while (lVar10 < *(int *)(this + 0x48));
  }
  if (0 < *(int *)(this + 0x58)) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      lVar4 = *(long *)(this + 0x60);
      proto_02 = internal::RepeatedPtrFieldBase::
                 Add<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                           (&(proto->enum_type_).super_RepeatedPtrFieldBase,(Type *)0x0);
      EnumDescriptor::CopyTo((EnumDescriptor *)(lVar4 + lVar11),proto_02);
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0x38;
    } while (lVar10 < *(int *)(this + 0x58));
  }
  if (0 < *(int *)(this + 0x68)) {
    lVar10 = 0;
    do {
      pTVar6 = internal::RepeatedPtrFieldBase::
               Add<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                         (&(proto->extension_range_).super_RepeatedPtrFieldBase,(Type *)0x0);
      lVar11 = *(long *)(this + 0x70);
      iVar1 = *(int32 *)(lVar11 + lVar10 * 8);
      uVar2 = (pTVar6->_has_bits_).has_bits_[0];
      (pTVar6->_has_bits_).has_bits_[0] = uVar2 | 1;
      pTVar6->start_ = iVar1;
      iVar1 = *(int32 *)(lVar11 + 4 + lVar10 * 8);
      (pTVar6->_has_bits_).has_bits_[0] = uVar2 | 3;
      pTVar6->end_ = iVar1;
      lVar10 = lVar10 + 1;
    } while (lVar10 < *(int *)(this + 0x68));
  }
  if (0 < *(int *)(this + 0x78)) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      lVar4 = *(long *)(this + 0x80);
      pTVar5 = internal::RepeatedPtrFieldBase::
               Add<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(proto->extension_).super_RepeatedPtrFieldBase,(Type *)0x0);
      FieldDescriptor::CopyTo((FieldDescriptor *)(lVar4 + lVar11),pTVar5);
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0xa8;
    } while (lVar10 < *(int *)(this + 0x78));
  }
  if (0 < *(int *)(this + 0x88)) {
    lVar10 = 0;
    do {
      pTVar7 = internal::RepeatedPtrFieldBase::
               Add<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
                         (&(proto->reserved_range_).super_RepeatedPtrFieldBase,(Type *)0x0);
      lVar11 = *(long *)(this + 0x90);
      iVar1 = *(int32 *)(lVar11 + lVar10 * 8);
      uVar2 = (pTVar7->_has_bits_).has_bits_[0];
      (pTVar7->_has_bits_).has_bits_[0] = uVar2 | 1;
      pTVar7->start_ = iVar1;
      iVar1 = *(int32 *)(lVar11 + 4 + lVar10 * 8);
      (pTVar7->_has_bits_).has_bits_[0] = uVar2 | 3;
      pTVar7->end_ = iVar1;
      lVar10 = lVar10 + 1;
    } while (lVar10 < *(int *)(this + 0x88));
  }
  if (0 < *(int *)(this + 0x98)) {
    lVar10 = 0;
    do {
      DescriptorProto::add_reserved_name(proto,*(string **)(*(long *)(this + 0xa0) + lVar10 * 8));
      lVar10 = lVar10 + 1;
    } while (lVar10 < *(int *)(this + 0x98));
  }
  pMVar9 = *(MessageOptions **)(this + 0x20);
  pMVar8 = MessageOptions::default_instance();
  if (pMVar9 != pMVar8) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
    pMVar9 = proto->options_;
    if (pMVar9 == (MessageOptions *)0x0) {
      pMVar9 = (MessageOptions *)operator_new(0x70);
      MessageOptions::MessageOptions(pMVar9);
      proto->options_ = pMVar9;
    }
    MessageOptions::CopyFrom(pMVar9,*(MessageOptions **)(this + 0x20));
    return;
  }
  return;
}

Assistant:

void Descriptor::CopyTo(DescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < field_count(); i++) {
    field(i)->CopyTo(proto->add_field());
  }
  for (int i = 0; i < oneof_decl_count(); i++) {
    oneof_decl(i)->CopyTo(proto->add_oneof_decl());
  }
  for (int i = 0; i < nested_type_count(); i++) {
    nested_type(i)->CopyTo(proto->add_nested_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < extension_range_count(); i++) {
    DescriptorProto::ExtensionRange* range = proto->add_extension_range();
    range->set_start(extension_range(i)->start);
    range->set_end(extension_range(i)->end);
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }
  for (int i = 0; i < reserved_range_count(); i++) {
    DescriptorProto::ReservedRange* range = proto->add_reserved_range();
    range->set_start(reserved_range(i)->start);
    range->set_end(reserved_range(i)->end);
  }
  for (int i = 0; i < reserved_name_count(); i++) {
    proto->add_reserved_name(reserved_name(i));
  }

  if (&options() != &MessageOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}